

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream_serializer.h
# Opt level: O0

ssize_t __thiscall
crnlib::data_stream_serializer::read
          (data_stream_serializer *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  uint n;
  uint actual_size;
  uint count_local;
  uint size_local;
  void *pBuf_local;
  data_stream_serializer *this_local;
  
  this_local._4_4_ = (uint)__nbytes;
  uVar1 = (uint)__buf * this_local._4_4_;
  if (uVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    uVar2 = (*this->m_pStream->_vptr_data_stream[4])
                      (this->m_pStream,CONCAT44(in_register_00000034,__fd),(ulong)uVar1);
    if (uVar2 != uVar1) {
      this_local._4_4_ = uVar2 / (uint)__buf;
    }
  }
  return (ulong)this_local._4_4_;
}

Assistant:

uint read(void* pBuf, uint size, uint count)
        {
            uint actual_size = size * count;
            if (!actual_size)
            {
                return 0;
            }
            uint n = m_pStream->read(pBuf, actual_size);
            if (n == actual_size)
            {
                return count;
            }
            return n / size;
        }